

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O2

void __thiscall Fl_Help_View_Type::Fl_Help_View_Type(Fl_Help_View_Type *this)

{
  Fl_Widget_Type::Fl_Widget_Type(&this->super_Fl_Widget_Type);
  (this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type = (_func_int **)&PTR_setlabel_00275720;
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Help_View *myo = (Fl_Help_View *)o;
    fl_font(myo->textfont(), myo->textsize());
    h -= Fl::box_dh(o->box());
    w -= Fl::box_dw(o->box());
    int ww = (int)fl_width('m');
    w = ((w + ww - 1) / ww) * ww + Fl::box_dw(o->box());
    h = ((h + fl_height() - 1) / fl_height()) * fl_height() +
        Fl::box_dh(o->box());
    if (h < 30) h = 30;
    if (w < 50) w = 50;
  }